

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerSettings.cpp
# Opt level: O1

bool __thiscall SWDAnalyzerSettings::SetSettingsFromInterfaces(SWDAnalyzerSettings *this)

{
  Channel *this_00;
  Channel *this_01;
  char cVar1;
  Channel aCStack_48 [16];
  Channel local_38 [16];
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::Channel(local_38,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar1 = Channel::operator==(aCStack_48,local_38);
  Channel::~Channel(local_38);
  Channel::~Channel(aCStack_48);
  if (cVar1 == '\0') {
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::Channel(local_38,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    cVar1 = Channel::operator==(aCStack_48,local_38);
    Channel::~Channel(local_38);
    Channel::~Channel(aCStack_48);
    if (cVar1 == '\0') {
      AnalyzerSettingInterfaceChannel::GetChannel();
      this_00 = &this->mSWDIO;
      Channel::operator=(this_00,aCStack_48);
      Channel::~Channel(aCStack_48);
      AnalyzerSettingInterfaceChannel::GetChannel();
      this_01 = &this->mSWCLK;
      Channel::operator=(this_01,aCStack_48);
      Channel::~Channel(aCStack_48);
      cVar1 = Channel::operator==(this_00,this_01);
      if (cVar1 == '\0') {
        AnalyzerSettings::ClearChannels();
        AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
        AnalyzerSettings::AddChannel((Channel *)this,(char *)this_01,true);
        return true;
      }
    }
  }
  AnalyzerSettings::SetErrorText((char *)this);
  return false;
}

Assistant:

bool SWDAnalyzerSettings::SetSettingsFromInterfaces()
{
    if( mSWDIOInterface.GetChannel() == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select an input for the channel 1." );
        return false;
    }

    if( mSWCLKInterface.GetChannel() == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select an input for the channel 2." );
        return false;
    }

    mSWDIO = mSWDIOInterface.GetChannel();
    mSWCLK = mSWCLKInterface.GetChannel();

    if( mSWDIO == mSWCLK )
    {
        SetErrorText( "Please select different inputs for the channels." );
        return false;
    }

    ClearChannels();

    AddChannel( mSWDIO, "SWDIO", true );
    AddChannel( mSWCLK, "SWCLK", true );

    return true;
}